

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_GLMRegressor_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::GLMRegressor_DoubleArray>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::GLMRegressor_DoubleArray> *)
             _GLMRegressor_DoubleArray_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::GLMRegressor>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::GLMRegressor> *)
             _GLMRegressor_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _GLMRegressor_DoubleArray_default_instance_.Shutdown();
  _GLMRegressor_default_instance_.Shutdown();
}